

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int analysisLoader(void *pData,int argc,char **argv,char **NotUsed)

{
  byte bVar1;
  ushort uVar2;
  Table *pTVar3;
  Index *aLog;
  long lVar4;
  char *pcVar5;
  Index *in_R8;
  Index fakeIdx;
  LogEst aLStack_88 [46];
  LogEst local_2c;
  
  if (argv == (char **)0x0) {
    return 0;
  }
  if (*argv == (char *)0x0) {
    return 0;
  }
  if (argv[2] == (char *)0x0) {
    return 0;
  }
  pTVar3 = sqlite3FindTable(*pData,*argv,*(char **)((long)pData + 8));
  if (pTVar3 == (Table *)0x0) {
    return 0;
  }
  pcVar5 = argv[1];
  if (pcVar5 == (char *)0x0) goto LAB_0014cb4c;
  if (*argv != (char *)0x0) {
    lVar4 = 0;
    do {
      bVar1 = (*argv)[lVar4];
      in_R8 = (Index *)(ulong)(byte)pcVar5[lVar4];
      if (bVar1 == pcVar5[lVar4]) {
        if ((ulong)bVar1 == 0) goto LAB_0014cb2d;
      }
      else if (""[bVar1] != *(uchar *)&in_R8[0x3c46].aColExpr) break;
      lVar4 = lVar4 + 1;
    } while( true );
  }
  aLog = sqlite3FindIndex(*pData,pcVar5,*(char **)((long)pData + 8));
  pcVar5 = argv[2];
  if (aLog != (Index *)0x0) {
    uVar2 = *(ushort *)&aLog->field_0x63;
LAB_0014caf7:
    *(ushort *)&aLog->field_0x63 = uVar2 & 0xfffb;
    decodeIntArray(pcVar5,aLog->nKeyCol + 1,(tRowcnt *)aLog->aiRowLogEst,(LogEst *)aLog,in_R8);
    aLog->field_0x63 = aLog->field_0x63 | 0x80;
    if (aLog->pPartIdxWhere != (Expr *)0x0) {
      return 0;
    }
    pTVar3->nRowLogEst = *aLog->aiRowLogEst;
    goto LAB_0014cb79;
  }
  goto LAB_0014cb50;
LAB_0014cb2d:
  for (aLog = pTVar3->pIndex; aLog != (Index *)0x0; aLog = aLog->pNext) {
    uVar2 = *(ushort *)&aLog->field_0x63;
    if ((uVar2 & 3) == 2) {
      pcVar5 = argv[2];
      goto LAB_0014caf7;
    }
  }
LAB_0014cb4c:
  pcVar5 = argv[2];
LAB_0014cb50:
  local_2c = pTVar3->szTabRow;
  decodeIntArray(pcVar5,1,(tRowcnt *)&pTVar3->nRowLogEst,aLStack_88,in_R8);
  pTVar3->szTabRow = local_2c;
LAB_0014cb79:
  *(byte *)&pTVar3->tabFlags = (byte)pTVar3->tabFlags | 0x10;
  return 0;
}

Assistant:

static int analysisLoader(void *pData, int argc, char **argv, char **NotUsed){
  analysisInfo *pInfo = (analysisInfo*)pData;
  Index *pIndex;
  Table *pTable;
  const char *z;

  assert( argc==3 );
  UNUSED_PARAMETER2(NotUsed, argc);

  if( argv==0 || argv[0]==0 || argv[2]==0 ){
    return 0;
  }
  pTable = sqlite3FindTable(pInfo->db, argv[0], pInfo->zDatabase);
  if( pTable==0 ){
    return 0;
  }
  if( argv[1]==0 ){
    pIndex = 0;
  }else if( sqlite3_stricmp(argv[0],argv[1])==0 ){
    pIndex = sqlite3PrimaryKeyIndex(pTable);
  }else{
    pIndex = sqlite3FindIndex(pInfo->db, argv[1], pInfo->zDatabase);
  }
  z = argv[2];

  if( pIndex ){
    tRowcnt *aiRowEst = 0;
    int nCol = pIndex->nKeyCol+1;
#ifdef SQLITE_ENABLE_STAT4
    /* Index.aiRowEst may already be set here if there are duplicate
    ** sqlite_stat1 entries for this index. In that case just clobber
    ** the old data with the new instead of allocating a new array.  */
    if( pIndex->aiRowEst==0 ){
      pIndex->aiRowEst = (tRowcnt*)sqlite3MallocZero(sizeof(tRowcnt) * nCol);
      if( pIndex->aiRowEst==0 ) sqlite3OomFault(pInfo->db);
    }
    aiRowEst = pIndex->aiRowEst;
#endif
    pIndex->bUnordered = 0;
    decodeIntArray((char*)z, nCol, aiRowEst, pIndex->aiRowLogEst, pIndex);
    pIndex->hasStat1 = 1;
    if( pIndex->pPartIdxWhere==0 ){
      pTable->nRowLogEst = pIndex->aiRowLogEst[0];
      pTable->tabFlags |= TF_HasStat1;
    }
  }else{
    Index fakeIdx;
    fakeIdx.szIdxRow = pTable->szTabRow;
#ifdef SQLITE_ENABLE_COSTMULT
    fakeIdx.pTable = pTable;
#endif
    decodeIntArray((char*)z, 1, 0, &pTable->nRowLogEst, &fakeIdx);
    pTable->szTabRow = fakeIdx.szIdxRow;
    pTable->tabFlags |= TF_HasStat1;
  }

  return 0;
}